

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
          (NetDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token netType,NetStrengthSyntax *strength,Token expansionHint,DataTypeSyntax *type,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  DeclaratorSyntax *pDVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  iterator_base<slang::syntax::DeclaratorSyntax_*> local_40;
  
  uVar5 = netType._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,NetDeclaration,attributes);
  (this->netType).kind = (short)uVar5;
  (this->netType).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->netType).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->netType).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->netType).info = netType.info;
  this->strength = strength;
  (this->expansionHint).kind = expansionHint.kind;
  (this->expansionHint).field_0x2 = expansionHint._2_1_;
  (this->expansionHint).numFlags = (NumericTokenFlags)expansionHint.numFlags.raw;
  (this->expansionHint).rawLen = expansionHint.rawLen;
  (this->expansionHint).info = expansionHint.info;
  (this->type).ptr = type;
  this->delay = delay;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00596a58;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (strength != (NetStrengthSyntax *)0x0) {
    (strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (delay != (TimingControlSyntax *)0x0) {
    (delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_40.index = 0;
  sVar1 = (this->declarators).elements._M_extent._M_extent_value;
  local_40.list = &this->declarators;
  for (; (local_40.list != &this->declarators || (local_40.index != sVar1 + 1 >> 1));
      local_40.index = local_40.index + 1) {
    pDVar4 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&local_40);
    (pDVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

NetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, NetStrengthSyntax* strength, Token expansionHint, DataTypeSyntax& type, TimingControlSyntax* delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::NetDeclaration, attributes), netType(netType), strength(strength), expansionHint(expansionHint), type(&type), delay(delay), declarators(declarators), semi(semi) {
        if (this->strength) this->strength->parent = this;
        this->type->parent = this;
        if (this->delay) this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }